

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O3

bool findDirs(string *path,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *dirsList)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  dirent64 *__ptr;
  dirent **namelist;
  string dirName;
  dirent64 **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dirsList;
  uVar1 = scandir64((path->_M_dataplus)._M_p,&local_a0,(__selector *)0x0,(__cmp *)0x0);
  if (-1 < (int)uVar1) {
    if (uVar1 != 0) {
      uVar6 = (ulong)uVar1;
      do {
        __ptr = local_a0[uVar6 - 1];
        if (__ptr->d_type == '\x04') {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          sVar3 = strlen(__ptr->d_name);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,__ptr->d_name,__ptr->d_name + sVar3);
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_50);
            if (iVar2 != 0) {
              std::operator+(&local_70,path,&local_50);
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
              psVar5 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar5) {
                local_98.field_2._M_allocated_capacity = *psVar5;
                local_98.field_2._8_8_ = plVar4[3];
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              }
              else {
                local_98.field_2._M_allocated_capacity = *psVar5;
                local_98._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_98._M_string_length = plVar4[1];
              *plVar4 = (long)psVar5;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_78,&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          __ptr = local_a0[uVar6 - 1];
        }
        uVar6 = uVar6 - 1;
        free(__ptr);
      } while (uVar6 != 0);
    }
    free(local_a0);
  }
  return -1 < (int)uVar1;
}

Assistant:

bool findDirs(const string& path, vector<string>* dirsList)
{
    dirent** namelist;

    int n = scandir(path.c_str(), &namelist, 0, 0);  // alphasort);

    if (n < 0)
    {
        return false;
    }
    else
    {
        while (n--)
        {
            if (namelist[n]->d_type == DT_DIR)
            {
                string dirName(namelist[n]->d_name);

                // we save only normal ones
                if ("." != dirName && ".." != dirName)
                    dirsList->push_back(path + dirName + "/");
            }
            free(namelist[n]);
        }
        free(namelist);
    }

    return true;
}